

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btBvhTriangleMeshShape.cpp
# Opt level: O3

void __thiscall
btBvhTriangleMeshShape::btBvhTriangleMeshShape
          (btBvhTriangleMeshShape *this,btStridingMeshInterface *meshInterface,
          bool useQuantizedAabbCompression,btVector3 *bvhAabbMin,btVector3 *bvhAabbMax,bool buildBvh
          )

{
  btOptimizedBvh *this_00;
  undefined3 in_register_00000089;
  
  btTriangleMeshShape::btTriangleMeshShape(&this->super_btTriangleMeshShape,meshInterface);
  (this->super_btTriangleMeshShape).super_btConcaveShape.super_btCollisionShape.
  _vptr_btCollisionShape = (_func_int **)&PTR__btBvhTriangleMeshShape_0021ce90;
  this->m_bvh = (btOptimizedBvh *)0x0;
  this->m_triangleInfoMap = (btTriangleInfoMap *)0x0;
  this->m_useQuantizedAabbCompression = useQuantizedAabbCompression;
  this->m_ownsBvh = false;
  (this->super_btTriangleMeshShape).super_btConcaveShape.super_btCollisionShape.m_shapeType = 0x15;
  if (CONCAT31(in_register_00000089,buildBvh) != 0) {
    this_00 = (btOptimizedBvh *)btAlignedAllocInternal(0xf8,0x10);
    btOptimizedBvh::btOptimizedBvh(this_00);
    this->m_bvh = this_00;
    btOptimizedBvh::build
              (this_00,meshInterface,this->m_useQuantizedAabbCompression,bvhAabbMin,bvhAabbMax);
    this->m_ownsBvh = true;
  }
  return;
}

Assistant:

btBvhTriangleMeshShape::btBvhTriangleMeshShape(btStridingMeshInterface* meshInterface, bool useQuantizedAabbCompression,const btVector3& bvhAabbMin,const btVector3& bvhAabbMax,bool buildBvh)
:btTriangleMeshShape(meshInterface),
m_bvh(0),
m_triangleInfoMap(0),
m_useQuantizedAabbCompression(useQuantizedAabbCompression),
m_ownsBvh(false)
{
	m_shapeType = TRIANGLE_MESH_SHAPE_PROXYTYPE;
	//construct bvh from meshInterface
#ifndef DISABLE_BVH

	if (buildBvh)
	{
		void* mem = btAlignedAlloc(sizeof(btOptimizedBvh),16);
		m_bvh = new (mem) btOptimizedBvh();
		
		m_bvh->build(meshInterface,m_useQuantizedAabbCompression,bvhAabbMin,bvhAabbMax);
		m_ownsBvh = true;
	}

#endif //DISABLE_BVH

}